

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psmem.c
# Opt level: O0

int psmem_mrd(nettlp *nt,tlp_mr_hdr *mh,void *arg)

{
  uint uVar1;
  uint uVar2;
  uint16_t uVar3;
  int iVar4;
  ssize_t sVar5;
  ulong *in_RDX;
  tlp_mr_hdr *in_RSI;
  nettlp *in_RDI;
  ssize_t send_len;
  iovec iov [3];
  tlp_cpl_hdr ch;
  nettlp_hdr nh;
  uintptr_t addr;
  ssize_t data_len;
  ssize_t len;
  psmem *p;
  int ret;
  long local_a8;
  tlp_mr_hdr *in_stack_ffffffffffffff60;
  undefined1 *local_98;
  tlp_mr_hdr *mh_00;
  undefined4 local_5a;
  uint16_t local_56;
  uint16_t local_54;
  uint16_t local_52;
  uint8_t local_50;
  byte local_4f;
  undefined1 local_4e [6];
  ulong local_48;
  long local_40;
  long local_38;
  ulong *local_30;
  int local_24;
  tlp_mr_hdr *local_18;
  nettlp *local_10;
  int local_4;
  
  local_30 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  usleep(mrd_sleep);
  local_98 = local_4e;
  mh_00 = (tlp_mr_hdr *)0x6;
  uVar3 = ntohs((local_18->tlp).falen);
  local_38 = (long)(int)((uVar3 & 0x3ff) << 2);
  local_48 = tlp_mr_addr(mh_00);
  iVar4 = tlp_mr_data_length(in_stack_ffffffffffffff60);
  local_40 = (long)iVar4;
  if (nostdout == 0) {
    fprintf(_stdout,"%s: MRd to 0x%lx, tag 0x%02x %lu byte\n","psmem_mrd",
            local_48 & 0xfffffffffffffffc,(ulong)local_18->tag,local_40);
  }
  if ((local_48 < *local_30) || (*local_30 + local_30[1] < local_48 + local_38)) {
    fprintf(_stderr,"%s:ERR: MRd request to 0x%lx, stick out of the pseudo memory region\n",
            "psmem_mrd",local_48);
    send_cpl_abort(local_10,local_18);
    local_4 = -1;
  }
  else {
    do {
      if (local_38 < 0x100) {
        local_a8 = local_38;
      }
      else {
        local_a8 = 0x100;
      }
      memset(local_4e,0,6);
      memset(&local_5a,0,0xc);
      uVar1 = (uint)local_18->tlp & 0xffffff80;
      local_5a = uVar1 | 0x4a;
      uVar2 = local_5a;
      local_5a._2_2_ = (uint16_t)(uVar1 >> 0x10);
      uVar3 = local_5a._2_2_;
      local_5a = uVar2;
      uVar3 = ntohs(uVar3);
      uVar3 = htons(uVar3 & 0xfc00 | (ushort)(local_a8 >> 2));
      local_5a = CONCAT22(uVar3,(undefined2)local_5a);
      uVar3 = ntohs(local_54);
      local_54 = htons(uVar3 & 0x1fff);
      uVar3 = ntohs(local_54);
      local_54 = htons(uVar3 & 0xf000 | (ushort)local_40);
      local_56 = htons(local_10->requester);
      local_52 = local_18->requester;
      local_50 = local_18->tag;
      local_4f = (byte)local_48 & 0x7f;
      sVar5 = writev(local_10->sockfd,(iovec *)&local_98,3);
      local_24 = (int)sVar5;
      if (local_24 < 0) {
        fprintf(_stderr,"%s:ERR: writev failed\n","psmem_mrd");
        perror("writev");
      }
      local_38 = local_38 - local_a8;
      local_40 = local_40 - (local_a8 - (local_48 & 3));
      local_48 = (local_48 & 0xfffffffffffffffc) + local_a8;
    } while (0 < local_40);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int psmem_mrd(struct nettlp *nt, struct tlp_mr_hdr *mh, void *arg)
{
	int ret;
	struct psmem *p = arg;
	ssize_t len, data_len;
	uintptr_t addr;
	struct nettlp_hdr nh;
	struct tlp_cpl_hdr ch;
	struct iovec iov[3];

	usleep(mrd_sleep);

	/* CplD packet */
	iov[0].iov_base = &nh;
	iov[0].iov_len = sizeof(nh);
	iov[1].iov_base = &ch;
	iov[1].iov_len = sizeof(ch);

	len = tlp_length(mh->tlp.falen) << 2;
	addr = tlp_mr_addr(mh);
	data_len = tlp_mr_data_length(mh);	/* actuary transfer data len */

	pr_info("MRd to 0x%lx, tag 0x%02x %lu byte\n",
		(addr >> 2) << 2, mh->tag, data_len);

	if (addr < p->addr || addr + len > p->addr + p->size) {
		pr_err("MRd request to 0x%lx, "
		       "stick out of the pseudo memory region\n", addr);
		send_cpl_abort(nt, mh);
		return -1;
	}

	do {
		ssize_t send_len;
		send_len = len < MAXPAYLOADSIZE ? len : MAXPAYLOADSIZE;
		
		memset(&nh, 0, sizeof(nh));
		memset(&ch, 0, sizeof(ch));

		/* XXX: copy flag and attribute. should handle properly */
		memcpy(&ch.tlp, &mh->tlp, sizeof(struct tlp_hdr));

		/* Build CplD header */
		tlp_set_fmt(ch.tlp.fmt_type, TLP_FMT_3DW, TLP_FMT_W_DATA);
		tlp_set_type(ch.tlp.fmt_type, TLP_TYPE_Cpl);
		tlp_set_length(ch.tlp.falen, send_len >> 2);
		tlp_set_cpl_status(ch.stcnt, TLP_CPL_STATUS_SC);
		tlp_set_cpl_bcnt(ch.stcnt, data_len);
		ch.completer = htons(nt->requester);
		ch.requester = mh->requester;
		ch.tag = mh->tag;
		ch.lowaddr = addr & 0x7F;

		/* memory to be sent */
		iov[2].iov_base = p->mem + (((addr >> 2) << 2) - p->addr);
		iov[2].iov_len = send_len;

		ret = writev(nt->sockfd, iov, 3);
		if (ret < 0) {
			pr_err("writev failed\n");
			perror("writev");
		}

		len -= send_len;
		data_len -= send_len - (addr & 0x3);
		addr = ((addr >> 2) << 2) + send_len;

	} while (data_len > 0);

	return 0;
}